

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O2

void __thiscall test_suite::detail::simple_runner::~simple_runner(simple_runner *this)

{
  long lVar1;
  ostream *poVar2;
  elapsed local_18;
  
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__simple_runner_00129490;
  poVar2 = this->log_;
  lVar1 = std::chrono::_V2::steady_clock::now();
  local_18.d.__r = (duration)(lVar1 - (this->all_).start.__d.__r);
  poVar2 = operator<<(poVar2,&local_18);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," suites, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," failures, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," total.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  _Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
  ::~_Vector_base(&(this->v_).
                   super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
                 );
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__runner_00129500;
  current()::p = (this->super_runner).saved_;
  return;
}

Assistant:

~simple_runner()
  {
    log_ <<
         elapsed{clock_type::now() -
                 all_.start } << ", " <<
         v_.size() << " suites, " <<
         all_.failed.load() << " failures, " <<
         all_.total.load() << " total." <<
         std::endl;
  }